

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::MinorGCSweep(GC *this)

{
  _func_int **pp_Var1;
  GCObject *in_RDI;
  function<void_(luna::GCObject_*,_unsigned_int)> *unaff_retaddr;
  GCObject *obj;
  GCObject *__args;
  
  __args = in_RDI;
  while (in_RDI->_vptr_GCObject != (_func_int **)0x0) {
    pp_Var1 = in_RDI->_vptr_GCObject;
    in_RDI->_vptr_GCObject = (_func_int **)in_RDI->_vptr_GCObject[1];
    if ((*(byte *)(pp_Var1 + 2) >> 2 & 3) == 1) {
      *(byte *)(pp_Var1 + 2) = *(byte *)(pp_Var1 + 2) & 0xf3;
      *(byte *)(pp_Var1 + 2) = *(byte *)(pp_Var1 + 2) & 0xfc | 1;
      pp_Var1[1] = *(_func_int **)&in_RDI->field_0x10;
      *(_func_int ***)&in_RDI->field_0x10 = pp_Var1;
      *(int *)&in_RDI[1]._vptr_GCObject = *(int *)&in_RDI[1]._vptr_GCObject + 1;
    }
    else {
      std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
                (unaff_retaddr,__args,(uint)((ulong)pp_Var1 >> 0x20));
    }
  }
  *(undefined4 *)&in_RDI->next_ = 0;
  return;
}

Assistant:

void GC::MinorGCSweep()
    {
        // Sweep GCGen0
        while (gen0_.gen_)
        {
            GCObject *obj = gen0_.gen_;
            gen0_.gen_ = gen0_.gen_->next_;

            // Move object to GCGen1 generation when object is black
            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->generation_ = GCGen1;
                obj->next_ = gen1_.gen_;
                gen1_.gen_ = obj;
                gen1_.count_++;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
            }
        }

        gen0_.count_ = 0;
    }